

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O0

priority_queue * qp_new(size_t size)

{
  void *pvVar1;
  priority_queue *result;
  size_t size_local;
  
  if (size < 0x1000000000000000) {
    size_local = (size_t)mem_alloc(0x18);
    pvVar1 = mem_alloc(size << 4);
    *(void **)size_local = pvVar1;
    *(size_t *)(size_local + 8) = size;
    *(undefined8 *)(size_local + 0x10) = 0;
  }
  else {
    size_local = 0;
  }
  return (priority_queue *)size_local;
}

Assistant:

struct priority_queue *qp_new(size_t size)
{
	struct priority_queue *result;

	if (size > SIZE_MAX / MAX(2, sizeof(struct priority_queue_element))) {
		return NULL;
	}
	result = mem_alloc(sizeof(*result));
	result->data = mem_alloc(size * sizeof(*result->data));
	result->size = size;
	result->count = 0;
	return result;
}